

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_Compare_Test::TestBody(ECCurveTest_Compare_Test *this)

{
  bool bVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *p_00;
  EC_POINT *b;
  point_conversion_form_t form;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *lhs;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  UniquePtr<EC_POINT> inf1;
  AssertionResult gtest_ar__4;
  UniquePtr<EC_POINT> q;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  UniquePtr<EC_POINT> inf2;
  UniquePtr<EC_POINT> p;
  AssertHelper local_58;
  UniquePtr<EC_KEY> key2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized;
  UniquePtr<EC_KEY> key1;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  key1._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar3);
  serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(serialized.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                         key1._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
                         (_Head_base<0UL,_ec_key_st_*,_false>)0x0);
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key1._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&serialized,(AssertionResult *)0x49efa9,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x265,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&key2,(Message *)&gtest_ar__4);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                key1._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(serialized.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_7_,iVar2 != 0);
    if (iVar2 != 0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
      p_00 = (EC_POINT *)
             EC_KEY_get0_public_key
                       ((EC_KEY *)
                        key1._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      pPVar3 = testing::WithParamInterface<int>::GetParam();
      key2._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
           EC_KEY_new_by_curve_name(*pPVar3);
      serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(serialized.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                             (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                             key2._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                             _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
                             (_Head_base<0UL,_ec_key_st_*,_false>)0x0);
      if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
          key2._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&gtest_ar__4);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&serialized,(AssertionResult *)0x4ad753,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&p,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x26a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&p,(Message *)&gtest_ar__4);
LAB_0029ceac:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&serialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&serialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish);
        iVar2 = EC_KEY_generate_key((EC_KEY *)
                                    key2._M_t.
                                    super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(serialized.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,iVar2 != 0);
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&gtest_ar__4);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&serialized,
                     (AssertionResult *)"EC_KEY_generate_key(key2.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&p,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x26b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&p,(Message *)&gtest_ar__4);
          goto LAB_0029ceac;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&serialized.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish);
        b = EC_KEY_get0_public_key
                      ((EC_KEY *)
                       key2._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(serialized.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
        gtest_ar__4._0_4_ =
             EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,(EC_POINT *)p_00,b,
                          (BN_CTX *)0x0);
        lhs = &serialized;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"1","EC_POINT_cmp(group(), pub1, pub2, nullptr)",(int *)lhs
                   ,(int *)&gtest_ar__4);
        form = (point_conversion_form_t)lhs;
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&serialized);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          form = 0x26f;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x26f,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__4,(Message *)&serialized);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
          if (serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)serialized.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar1 = EncodeECPoint(&serialized,(this->super_ECCurveTest).group_,p_00,form);
        gtest_ar__4.success_ = bVar1;
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar1) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
          p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
               EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__4.success_ =
               (tuple<ec_point_st_*,_bssl::internal::Deleter>)
               p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
               (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
          if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
              p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
              (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
            testing::Message::Message((Message *)&q);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar__4,(AssertionResult *)0x4c5fec,
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&inf1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x277,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=((AssertHelper *)&inf1,(Message *)&q);
LAB_0029d2d8:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inf1);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
              (**(code **)(*(long *)q._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))()
              ;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            iVar2 = EC_POINT_oct2point((EC_GROUP *)(this->super_ECCurveTest).group_,
                                       (EC_POINT *)
                                       p._M_t.
                                       super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                       serialized.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (long)serialized.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)serialized.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start,(BN_CTX *)0x0
                                      );
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__4.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&q);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                         (AssertionResult *)
                         "EC_POINT_oct2point(group(), p.get(), serialized.data(), serialized.size(), nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&inf1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x279,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&inf1,(Message *)&q);
              goto LAB_0029d2d8;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            gtest_ar__4.success_ = false;
            gtest_ar__4._1_3_ = 0;
            q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl._0_4_ =
                 EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                              (EC_POINT *)
                              p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                              (EC_POINT *)p_00,(BN_CTX *)0x0);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                       (int *)&gtest_ar__4,(int *)&q);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__4);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&q,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x27c,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&q,(Message *)&gtest_ar__4)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&q);
              if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)
                                 p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                 (EC_POINT *)
                                 p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,b,
                                 (BN_CTX *)0x0);
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__4.success_ = iVar2 != 0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&q);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                         (AssertionResult *)"EC_POINT_add(group(), p.get(), p.get(), pub2, nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&inf1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x27f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&inf1,(Message *)&q);
              goto LAB_0029d2d8;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            gtest_ar__4.success_ = true;
            gtest_ar__4._1_3_ = 0;
            iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)
                                 p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                 .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                 (EC_POINT *)p_00,(BN_CTX *)0x0);
            q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl._0_4_ = iVar2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"1","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                       (int *)&gtest_ar__4,(int *)&q);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar__4);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&q,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x280,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&q,(Message *)&gtest_ar__4)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&q);
              if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                 (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                 EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__4.success_ =
                 (tuple<ec_point_st_*,_bssl::internal::Deleter>)
                 q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                 (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
            if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
                q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&inf1);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar__4,(AssertionResult *)0x4dad3f,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&inf2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x285,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=((AssertHelper *)&inf2,(Message *)&inf1);
LAB_0029d6be:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inf2);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                (**(code **)(*(long *)inf1._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8)
                )();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
              iVar2 = EC_POINT_copy((EC_POINT *)
                                    q._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,b);
              gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__4.success_ = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&inf1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                           (AssertionResult *)"EC_POINT_copy(q.get(), pub2)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&inf2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x286,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&inf2,(Message *)&inf1);
                goto LAB_0029d6be;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
              iVar2 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                                      (EC_POINT *)
                                      q._M_t.
                                      super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                      (BN_CTX *)0x0);
              gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__4.success_ = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&inf1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                           (AssertionResult *)"EC_POINT_invert(group(), q.get(), nullptr)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&inf2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x287,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&inf2,(Message *)&inf1);
                goto LAB_0029d6be;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
              gtest_ar__4.success_ = true;
              gtest_ar__4._1_3_ = 0;
              inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl._0_4_ =
                   EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                (EC_POINT *)
                                q._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,b,
                                (BN_CTX *)0x0);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"1","EC_POINT_cmp(group(), q.get(), pub2, nullptr)",
                         (int *)&gtest_ar__4,(int *)&inf1);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__4);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&inf1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x288,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&inf1,(Message *)&gtest_ar__4);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inf1);
                if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   p._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (EC_POINT *)
                                   p._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (EC_POINT *)
                                   q._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (BN_CTX *)0x0);
              gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__4.success_ = iVar2 != 0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&inf1);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                           (AssertionResult *)
                           "EC_POINT_add(group(), p.get(), p.get(), q.get(), nullptr)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&inf2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x28b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=((AssertHelper *)&inf2,(Message *)&inf1);
                goto LAB_0029d6be;
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
              gtest_ar__4.success_ = false;
              gtest_ar__4._1_3_ = 0;
              iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   p._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                   (EC_POINT *)p_00,(BN_CTX *)0x0);
              inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"0","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                         (int *)&gtest_ar__4,(int *)&inf1);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__4);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&inf1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x28c,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&inf1,(Message *)&gtest_ar__4);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inf1);
                if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                   EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              inf2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
                   (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
                   EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__4.success_ =
                   (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                   inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                   (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0;
              if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                  inf1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                  (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                testing::Message::Message((Message *)&local_90);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar,(internal *)&gtest_ar__4,(AssertionResult *)"inf1",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_58,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x291,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
LAB_0029d9c6:
                this_00 = &gtest_ar__4.message_;
                testing::internal::AssertHelper::~AssertHelper(&local_58);
                std::__cxx11::string::~string((string *)&gtest_ar);
                if ((long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) + 8))();
                }
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__4.message_);
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__4.success_ =
                     (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                     inf2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
                     (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0;
                if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
                    inf2._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
                    (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar__4,(AssertionResult *)"inf2",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x292,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
                  goto LAB_0029d9c6;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__4.message_);
                iVar2 = EC_POINT_set_to_infinity
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)
                                   inf1._M_t.
                                   super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl);
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__4.success_ = iVar2 != 0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                             (AssertionResult *)"EC_POINT_set_to_infinity(group(), inf1.get())",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x293,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
                  goto LAB_0029d9c6;
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__4.message_);
                iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                     (EC_POINT *)
                                     inf2._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,b,
                                     (EC_POINT *)
                                     q._M_t.
                                     super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                     (BN_CTX *)0x0);
                this_00 = &gtest_ar__4.message_;
                gtest_ar__4.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar__4.success_ = iVar2 != 0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_90);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                             (AssertionResult *)
                             "EC_POINT_add(group(), inf2.get(), pub2, q.get(), nullptr)","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_58,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x295,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
                  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_90);
                  testing::internal::AssertHelper::~AssertHelper(&local_58);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if ((long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) + 8))()
                    ;
                  }
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(this_00);
                  gtest_ar__4.success_ = false;
                  gtest_ar__4._1_3_ = 0;
                  local_90.data_._0_4_ =
                       EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                    (EC_POINT *)
                                    inf1._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                    (EC_POINT *)
                                    inf2._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                    (BN_CTX *)0x0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"0",
                             "EC_POINT_cmp(group(), inf1.get(), inf2.get(), nullptr)",
                             (int *)&gtest_ar__4,(int *)&local_90);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar__4);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0x296,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__4);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar__4.success_ = true;
                  gtest_ar__4._1_3_ = 0;
                  local_90.data_._0_4_ =
                       EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                    (EC_POINT *)
                                    inf1._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                    (EC_POINT *)
                                    p._M_t.
                                    super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t
                                    .super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,
                                    (BN_CTX *)0x0);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"1",
                             "EC_POINT_cmp(group(), inf1.get(), p.get(), nullptr)",
                             (int *)&gtest_ar__4,(int *)&local_90);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar__4);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                               ,0x297,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar__4);
                    testing::internal::AssertHelper::~AssertHelper(&local_90);
                    if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
                    }
                  }
                  this_00 = &gtest_ar.message_;
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(this_00);
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&inf2);
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&inf1);
            }
            std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&q);
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p);
        }
        else {
          testing::Message::Message((Message *)&p);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar__4,
                     (AssertionResult *)
                     "EncodeECPoint(&serialized, group(), pub1, POINT_CONVERSION_UNCOMPRESSED)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&q,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x275,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&q,(Message *)&p);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&q);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
              p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key2);
      goto LAB_0029d712;
    }
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&serialized,
               (AssertionResult *)"EC_KEY_generate_key(key1.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x266,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&key2,(Message *)&gtest_ar__4);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar__4._4_4_,gtest_ar__4._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&serialized.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
LAB_0029d712:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key1);
  return;
}

Assistant:

TEST_P(ECCurveTest, Compare) {
  bssl::UniquePtr<EC_KEY> key1(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key1);
  ASSERT_TRUE(EC_KEY_generate_key(key1.get()));
  const EC_POINT *pub1 = EC_KEY_get0_public_key(key1.get());

  bssl::UniquePtr<EC_KEY> key2(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key2);
  ASSERT_TRUE(EC_KEY_generate_key(key2.get()));
  const EC_POINT *pub2 = EC_KEY_get0_public_key(key2.get());

  // Two different points should not compare as equal.
  EXPECT_EQ(1, EC_POINT_cmp(group(), pub1, pub2, nullptr));

  // Serialize |pub1| and parse it back out. This gives a point in affine
  // coordinates.
  std::vector<uint8_t> serialized;
  ASSERT_TRUE(
      EncodeECPoint(&serialized, group(), pub1, POINT_CONVERSION_UNCOMPRESSED));
  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_oct2point(group(), p.get(), serialized.data(),
                                 serialized.size(), nullptr));

  // The points should be equal.
  EXPECT_EQ(0, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Add something to the point. It no longer compares as equal.
  ASSERT_TRUE(EC_POINT_add(group(), p.get(), p.get(), pub2, nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Negate |pub2|. It should no longer compare as equal. This tests that we
  // check both x and y coordinate.
  bssl::UniquePtr<EC_POINT> q(EC_POINT_new(group()));
  ASSERT_TRUE(q);
  ASSERT_TRUE(EC_POINT_copy(q.get(), pub2));
  ASSERT_TRUE(EC_POINT_invert(group(), q.get(), nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), q.get(), pub2, nullptr));

  // Return |p| to the original value. It should be equal to |pub1| again.
  ASSERT_TRUE(EC_POINT_add(group(), p.get(), p.get(), q.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Infinity compares as equal to itself, but not other points.
  bssl::UniquePtr<EC_POINT> inf1(EC_POINT_new(group())),
      inf2(EC_POINT_new(group()));
  ASSERT_TRUE(inf1);
  ASSERT_TRUE(inf2);
  ASSERT_TRUE(EC_POINT_set_to_infinity(group(), inf1.get()));
  // |q| is currently -|pub2|.
  ASSERT_TRUE(EC_POINT_add(group(), inf2.get(), pub2, q.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), inf1.get(), inf2.get(), nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), inf1.get(), p.get(), nullptr));
}